

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::setFieldAttribute
          (QPDFFormFieldObjectHelper *this,string *key,string *utf8_value)

{
  string *key_00;
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  string *utf8_value_local;
  string *key_local;
  QPDFFormFieldObjectHelper *this_local;
  
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)utf8_value;
  utf8_value_local = key;
  key_local = (string *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  key_00 = utf8_value_local;
  QPDFObjectHandle::newUnicodeString(&local_40,(string *)local_20._M_pi);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&stack0xffffffffffffffd0,key_00,&local_40);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setFieldAttribute(std::string const& key, std::string const& utf8_value)
{
    oh().replaceKey(key, QPDFObjectHandle::newUnicodeString(utf8_value));
}